

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O2

bool __thiscall
cmStringCommand::HandleRandomCommand
          (cmStringCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  _Alloc_hider _Var2;
  size_type sVar3;
  bool bVar4;
  int iVar5;
  uint __seed;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  allocator local_dd;
  uint local_dc;
  vector<char,_std::allocator<char>_> result;
  string alphabet;
  char cmStringCommandDefaultAlphabet [63];
  
  uVar7 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start >> 5;
  if ((uVar7 < 6) && ((0x2bUL >> (uVar7 & 0x3f) & 1) != 0)) {
    std::__cxx11::string::string
              ((string *)cmStringCommandDefaultAlphabet,
               "sub-command RANDOM requires at least one argument.",(allocator *)&alphabet);
    cmCommand::SetError(&this->super_cmCommand,(string *)cmStringCommandDefaultAlphabet);
    std::__cxx11::string::~string((string *)cmStringCommandDefaultAlphabet);
    return false;
  }
  builtin_strncpy(cmStringCommandDefaultAlphabet + 0x20,"UIOPASDFGHJKLZXCVBNM0123456789",0x1f);
  builtin_strncpy(cmStringCommandDefaultAlphabet + 0x10,"jklzxcvbnmQWERTY",0x10);
  alphabet._M_dataplus._M_p = (pointer)&alphabet.field_2;
  alphabet._M_string_length = 0;
  builtin_strncpy(cmStringCommandDefaultAlphabet,"qwertyuiopasdfgh",0x10);
  alphabet.field_2._M_local_buf[0] = '\0';
  if (uVar7 < 4) {
    iVar5 = 5;
    uVar8 = 0;
    __seed = 0;
LAB_003964d6:
    std::__cxx11::string::assign((char *)&alphabet);
    if (alphabet._M_string_length != 0) goto LAB_003964f3;
    std::__cxx11::string::string
              ((string *)&result,"sub-command RANDOM invoked with bad alphabet.",&local_dd);
    cmCommand::SetError(&this->super_cmCommand,(string *)&result);
  }
  else {
    __seed = 0;
    iVar5 = 5;
    local_dc = 0;
    for (uVar9 = 1; uVar9 < uVar7 - 2; uVar9 = uVar9 + 1) {
      bVar4 = std::operator==((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + uVar9,"LENGTH");
      if (bVar4) {
        uVar9 = uVar9 + 1;
        iVar5 = atoi((args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[uVar9]._M_dataplus._M_p);
      }
      else {
        bVar4 = std::operator==((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + uVar9,"ALPHABET");
        if (bVar4) {
          uVar9 = uVar9 + 1;
          std::__cxx11::string::_M_assign((string *)&alphabet);
        }
        else {
          bVar4 = std::operator==((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar9,"RANDOM_SEED");
          if (bVar4) {
            uVar9 = uVar9 + 1;
            __seed = atoi((args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start[uVar9]._M_dataplus._M_p);
            local_dc = (uint)CONCAT71((uint7)(uint3)(__seed >> 8),1);
          }
        }
      }
    }
    uVar8 = local_dc;
    if (alphabet._M_string_length == 0) goto LAB_003964d6;
LAB_003964f3:
    sVar3 = alphabet._M_string_length;
    if (0 < iVar5) {
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      result.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      result.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      result.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      if (((~HandleRandomCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
             ::seeded | (byte)uVar8) & 1) != 0) {
        HandleRandomCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
        ::seeded = 1;
        if ((uVar8 & 1) == 0) {
          __seed = cmSystemTools::RandomSeed();
        }
        srand(__seed);
      }
      _Var2._M_p = alphabet._M_dataplus._M_p;
      auVar10._8_4_ = (int)(sVar3 >> 0x20);
      auVar10._0_8_ = sVar3;
      auVar10._12_4_ = 0x45300000;
      while (bVar4 = iVar5 != 0, iVar5 = iVar5 + -1, bVar4) {
        iVar6 = rand();
        std::vector<char,_std::allocator<char>_>::push_back
                  (&result,_Var2._M_p +
                           (int)((double)iVar6 *
                                 ((auVar10._8_8_ - 1.9342813113834067e+25) +
                                 ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0)) *
                                4.656612873077393e-10));
      }
      local_dd = (allocator)0x0;
      std::vector<char,_std::allocator<char>_>::emplace_back<char>(&result,(char *)&local_dd);
      cmMakefile::AddDefinition
                ((this->super_cmCommand).Makefile,pbVar1 + -1,
                 result.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start);
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                (&result.super__Vector_base<char,_std::allocator<char>_>);
      bVar4 = true;
      goto LAB_00396626;
    }
    std::__cxx11::string::string
              ((string *)&result,"sub-command RANDOM invoked with bad length.",&local_dd);
    cmCommand::SetError(&this->super_cmCommand,(string *)&result);
  }
  std::__cxx11::string::~string((string *)&result);
  bVar4 = false;
LAB_00396626:
  std::__cxx11::string::~string((string *)&alphabet);
  return bVar4;
}

Assistant:

bool cmStringCommand::HandleRandomCommand(std::vector<std::string> const& args)
{
  if (args.size() < 2 || args.size() == 3 || args.size() == 5) {
    this->SetError("sub-command RANDOM requires at least one argument.");
    return false;
  }

  static bool seeded = false;
  bool force_seed = false;
  unsigned int seed = 0;
  int length = 5;
  const char cmStringCommandDefaultAlphabet[] = "qwertyuiopasdfghjklzxcvbnm"
                                                "QWERTYUIOPASDFGHJKLZXCVBNM"
                                                "0123456789";
  std::string alphabet;

  if (args.size() > 3) {
    size_t i = 1;
    size_t stopAt = args.size() - 2;

    for (; i < stopAt; ++i) {
      if (args[i] == "LENGTH") {
        ++i;
        length = atoi(args[i].c_str());
      } else if (args[i] == "ALPHABET") {
        ++i;
        alphabet = args[i];
      } else if (args[i] == "RANDOM_SEED") {
        ++i;
        seed = static_cast<unsigned int>(atoi(args[i].c_str()));
        force_seed = true;
      }
    }
  }
  if (alphabet.empty()) {
    alphabet = cmStringCommandDefaultAlphabet;
  }

  double sizeofAlphabet = static_cast<double>(alphabet.size());
  if (sizeofAlphabet < 1) {
    this->SetError("sub-command RANDOM invoked with bad alphabet.");
    return false;
  }
  if (length < 1) {
    this->SetError("sub-command RANDOM invoked with bad length.");
    return false;
  }
  const std::string& variableName = args[args.size() - 1];

  std::vector<char> result;

  if (!seeded || force_seed) {
    seeded = true;
    srand(force_seed ? seed : cmSystemTools::RandomSeed());
  }

  const char* alphaPtr = alphabet.c_str();
  int cc;
  for (cc = 0; cc < length; cc++) {
    int idx = (int)(sizeofAlphabet * rand() / (RAND_MAX + 1.0));
    result.push_back(*(alphaPtr + idx));
  }
  result.push_back(0);

  this->Makefile->AddDefinition(variableName, &*result.begin());
  return true;
}